

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadLineDefs2(MapData *map)

{
  undefined1 auVar1 [16];
  DWORD DVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  line_t *plVar6;
  ushort *buffer;
  ushort *__dest;
  int *piVar7;
  double dVar8;
  double dVar9;
  line_t *local_68;
  int local_48;
  int j;
  ushort *local_38;
  maplinedef2_t *mld;
  char *mldf;
  line_t *plStack_20;
  int lumplen;
  line_t *ld;
  int skipped;
  int i;
  MapData *map_local;
  
  DVar2 = MapData::Size(map,2);
  numlines = (int)((ulong)(long)(int)DVar2 >> 4);
  uVar4 = (ulong)numlines;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0x98),0);
  if (SUB168(auVar1 * ZEXT816(0x98),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar6 = (line_t *)operator_new__(uVar5);
  if (uVar4 != 0) {
    local_68 = plVar6;
    do {
      line_t::line_t(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != plVar6 + uVar4);
  }
  lines = plVar6;
  TArray<int,_int>::Resize(&linemap,numlines);
  memset(lines,0,(long)numlines * 0x98);
  buffer = (ushort *)operator_new__((long)(int)DVar2);
  MapData::Read(map,2,buffer,-1);
  ld._4_4_ = 0;
  sidecount = 0;
  ld._0_4_ = 0;
  do {
    while( true ) {
      if (numlines <= (int)ld._4_4_) {
        if (0 < (int)ld) {
          ForceNodeBuild = true;
        }
        P_AllocateSideDefs(sidecount);
        plStack_20 = lines;
        local_38 = buffer;
        for (ld._4_4_ = 0; (int)ld._4_4_ < numlines; ld._4_4_ = ld._4_4_ + 1) {
          plStack_20->portalindex = 0xffffffff;
          for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
            plStack_20->args[local_48] = (uint)*(byte *)((long)local_38 + (long)local_48 + 7);
          }
          plStack_20->flags = (uint)local_38[2];
          plStack_20->special = (uint)(byte)local_38[3];
          plStack_20->v1 = vertexes + *local_38;
          plStack_20->v2 = vertexes + local_38[1];
          plStack_20->alpha = 1.0;
          P_SetSideNum(plStack_20->sidedef,local_38[6]);
          P_SetSideNum(plStack_20->sidedef + 1,local_38[7]);
          P_AdjustLine(plStack_20);
          P_SetLineID(ld._4_4_,plStack_20);
          P_SaveLineSpecial(plStack_20);
          if ((level.flags2 & 0x200) != 0) {
            plStack_20->flags = plStack_20->flags | 0x80000;
          }
          if ((level.flags2 & 0x400) != 0) {
            plStack_20->flags = plStack_20->flags | 0x100000;
          }
          if ((level.flags2 & 0x800) != 0) {
            plStack_20->flags = plStack_20->flags | 0x400000;
          }
          iVar3 = GET_SPAC(plStack_20->flags);
          plStack_20->activation = 1 << ((byte)iVar3 & 0x1f);
          if (plStack_20->activation == 0x80) {
            plStack_20->activation = 0x28;
          }
          else if (plStack_20->activation == 8) {
            plStack_20->activation = 0x28;
          }
          plStack_20->flags = plStack_20->flags & 0xffffe3ff;
          local_38 = local_38 + 8;
          plStack_20 = plStack_20 + 1;
        }
        if (buffer != (ushort *)0x0) {
          operator_delete__(buffer);
        }
        return;
      }
      __dest = buffer + (long)(int)ld._4_4_ * 8;
      if (*__dest != __dest[1]) break;
LAB_006b9c5c:
      Printf("Removing 0-length line %d\n",(ulong)(ld._4_4_ + (int)ld));
      memmove(__dest,__dest + 8,(long)(int)((numlines - ld._4_4_) + -1) << 4);
      ld._0_4_ = (int)ld + 1;
      numlines = numlines + -1;
    }
    dVar8 = vertex_t::fX(vertexes + *__dest);
    dVar9 = vertex_t::fX(vertexes + __dest[1]);
    if ((dVar8 == dVar9) && (!NAN(dVar8) && !NAN(dVar9))) {
      dVar8 = vertex_t::fY(vertexes + *__dest);
      dVar9 = vertex_t::fY(vertexes + __dest[1]);
      if ((dVar8 == dVar9) && (!NAN(dVar8) && !NAN(dVar9))) goto LAB_006b9c5c;
    }
    if (__dest[6] == 0xffff) {
      Printf("Line %d has no first side.\n",(ulong)ld._4_4_);
      __dest[6] = 0;
    }
    iVar3 = sidecount + 1;
    if (__dest[7] != 0xffff) {
      iVar3 = sidecount + 2;
    }
    sidecount = iVar3;
    piVar7 = TArray<int,_int>::operator[](&linemap,(long)(int)ld._4_4_);
    *piVar7 = ld._4_4_ + (int)ld;
    ld._4_4_ = ld._4_4_ + 1;
  } while( true );
}

Assistant:

void P_LoadLineDefs2 (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef2_t *mld;
		
	numlines = lumplen / sizeof(maplinedef2_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Remove any lines that have 0 length and count sidedefs used
	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef2_t*)mldf) + i;

		if (mld->v1 == mld->v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}
	if (skipped > 0)
	{
		ForceNodeBuild = true;
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef2_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		int j;

		ld->portalindex = UINT_MAX;

		for (j = 0; j < 5; j++)
			ld->args[j] = mld->args[j];

		ld->flags = LittleShort(mld->flags);
		ld->special = mld->special;

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];
		ld->alpha = 1.;	// [RH] Opaque by default

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SetLineID(i, ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		// convert the activation type
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;
	}
	delete[] mldf;
}